

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classarray.h
# Opt level: O3

ptrdiff_t __thiscall
soplex::
ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
::reMax(ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        *this,int newMax,int newSize)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  ulong uVar11;
  long lVar12;
  int *piVar13;
  uint n;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *newMem;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_28;
  
  if (newSize < 0) {
    newSize = this->thesize;
  }
  if (newMax <= newSize) {
    newMax = newSize;
  }
  n = 1;
  if (1 < newMax) {
    n = newMax;
  }
  if (n == this->themax) {
    this->thesize = newSize;
    return 0;
  }
  local_28 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)0x0;
  spx_alloc<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>*>
            (&local_28,n);
  uVar11 = 0;
  if ((0 < newSize) && (0 < this->thesize)) {
    lVar12 = 0x50;
    uVar11 = 0;
    do {
      pNVar3 = this->data;
      puVar1 = (undefined8 *)((long)(&pNVar3->val + -1) + lVar12);
      uVar4 = *puVar1;
      uVar5 = puVar1[1];
      puVar1 = (undefined8 *)((long)(&(pNVar3->val).m_backend.data + -1) + lVar12);
      uVar6 = *puVar1;
      uVar7 = puVar1[1];
      puVar1 = (undefined8 *)((long)(pNVar3->val).m_backend.data._M_elems + lVar12 + -0x30);
      uVar8 = *puVar1;
      uVar9 = puVar1[1];
      puVar1 = (undefined8 *)((long)(pNVar3->val).m_backend.data._M_elems + lVar12 + -0x20);
      uVar10 = puVar1[1];
      puVar2 = (undefined8 *)((long)(local_28->val).m_backend.data._M_elems + lVar12 + -0x20);
      *puVar2 = *puVar1;
      puVar2[1] = uVar10;
      puVar1 = (undefined8 *)((long)(local_28->val).m_backend.data._M_elems + lVar12 + -0x30);
      *puVar1 = uVar8;
      puVar1[1] = uVar9;
      puVar1 = (undefined8 *)((long)(&(local_28->val).m_backend.data + -1) + lVar12);
      *puVar1 = uVar6;
      puVar1[1] = uVar7;
      puVar1 = (undefined8 *)((long)(&local_28->val + -1) + lVar12);
      *puVar1 = uVar4;
      puVar1[1] = uVar5;
      *(undefined4 *)((long)(local_28->val).m_backend.data._M_elems + lVar12 + -0x10) =
           *(undefined4 *)((long)(pNVar3->val).m_backend.data._M_elems + lVar12 + -0x10);
      *(undefined1 *)((long)(local_28->val).m_backend.data._M_elems + lVar12 + -0xc) =
           *(undefined1 *)((long)(pNVar3->val).m_backend.data._M_elems + lVar12 + -0xc);
      *(undefined8 *)((long)(local_28->val).m_backend.data._M_elems + lVar12 + -8) =
           *(undefined8 *)((long)(pNVar3->val).m_backend.data._M_elems + lVar12 + -8);
      *(undefined4 *)((long)(local_28->val).m_backend.data._M_elems + lVar12) =
           *(undefined4 *)((long)(pNVar3->val).m_backend.data._M_elems + lVar12);
      uVar11 = uVar11 + 1;
      if ((uint)newSize <= uVar11) break;
      lVar12 = lVar12 + 0x54;
    } while ((long)uVar11 < (long)this->thesize);
    if (n <= (uint)uVar11) goto LAB_003aa0a8;
  }
  piVar13 = &local_28[uVar11].idx;
  lVar12 = n - uVar11;
  do {
    *(undefined8 *)(piVar13 + -2) = 0x1000000000;
    (((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *)(piVar13 + -0x14))->val).m_backend.data._M_elems[0] = 0;
    (((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *)(piVar13 + -0x14))->val).m_backend.data._M_elems[1] = 0;
    (piVar13 + -0x12)[0] = 0;
    (piVar13 + -0x12)[1] = 0;
    (piVar13 + -0x10)[0] = 0;
    (piVar13 + -0x10)[1] = 0;
    (piVar13 + -0xe)[0] = 0;
    (piVar13 + -0xe)[1] = 0;
    (piVar13 + -0xc)[0] = 0;
    (piVar13 + -0xc)[1] = 0;
    (piVar13 + -10)[0] = 0;
    (piVar13 + -10)[1] = 0;
    (piVar13 + -8)[0] = 0;
    (piVar13 + -8)[1] = 0;
    (piVar13 + -6)[0] = 0;
    (piVar13 + -6)[1] = 0;
    *(undefined8 *)((long)piVar13 + -0x13) = 0;
    *piVar13 = 0;
    piVar13 = piVar13 + 0x15;
    lVar12 = lVar12 + -1;
  } while (lVar12 != 0);
LAB_003aa0a8:
  lVar12 = (long)local_28 - (long)this->data;
  free(this->data);
  this->data = local_28;
  this->themax = n;
  this->thesize = newSize;
  return lVar12;
}

Assistant:

ptrdiff_t reMax(int newMax = 1, int newSize = -1)
   {
      /* process input */
      if(newSize < 0)
         newSize = size();

      if(newMax < 1)
         newMax = 1;

      if(newMax < newSize)
         newMax = newSize;

      /* nothing to reallocate */
      if(newMax == themax)
      {
         thesize = newSize;
         return 0;
      }

      /* allocate new memory */
      T* newMem = nullptr;
      spx_alloc(newMem, newMax);

      /* call copy constructor for first elements */
      int i;

      for(i = 0; i < size() && i < newSize; i++)
         new(&(newMem[i])) T(data[i]);

      /* call default constructor for remaining elements */
      for(; i < newMax; i++)
         new(&(newMem[i])) T();

      /* compute pointer difference */
      ptrdiff_t pshift = reinterpret_cast<char*>(newMem) - reinterpret_cast<char*>(data);

      /* free old memory */
      for(i = themax - 1; i >= 0; i--)
         data[i].~T();

      spx_free(data);

      /* assign new memory */
      data = newMem;
      themax = newMax;
      thesize = newSize;

      return pshift;
   }